

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# personal_settings.cpp
# Opt level: O2

void __thiscall
PersonalSettings::PersonalSettings
          (PersonalSettings *this,ArgumentDictionary *args,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
          *item_names)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  Color CVar3;
  ostream *poVar4;
  pair<Color,_Color> pVar5;
  allocator<char> local_2b2;
  allocator<char> local_2b1;
  Json settings_json;
  string local_290;
  string settings_path;
  string local_250;
  ifstream personal_settings_file;
  undefined4 uStack_22c;
  byte abStack_210 [488];
  
  p_Var1 = &(this->_item_names)._M_t._M_impl.super__Rb_tree_header;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_add_ingame_item_tracker = false;
  Color::Color(&this->_hud_color,'@',' ',0x80);
  Color::Color((Color *)&personal_settings_file,'\0',0xa0,0x80);
  Color::Color((Color *)&settings_path,'\0','@',' ');
  pVar5.second = settings_path._M_dataplus._M_p._0_4_;
  pVar5.first = _personal_settings_file;
  this->_nigel_colors = pVar5;
  this->_remove_music = false;
  this->_swap_overworld_music = false;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
               *)this,&item_names->_M_t);
  (this->_inventory_order)._M_elems[0x10] = '8';
  (this->_inventory_order)._M_elems[0x11] = '9';
  (this->_inventory_order)._M_elems[0x12] = ',';
  (this->_inventory_order)._M_elems[0x13] = '\x16';
  (this->_inventory_order)._M_elems[0x14] = '6';
  (this->_inventory_order)._M_elems[0x15] = ')';
  (this->_inventory_order)._M_elems[0x16] = '0';
  (this->_inventory_order)._M_elems[0x17] = '\'';
  (this->_inventory_order)._M_elems[0x18] = '(';
  (this->_inventory_order)._M_elems[0x19] = '*';
  (this->_inventory_order)._M_elems[0x1a] = '4';
  (this->_inventory_order)._M_elems[0x1b] = '!';
  (this->_inventory_order)._M_elems[0x1c] = '\"';
  (this->_inventory_order)._M_elems[0x1d] = '3';
  (this->_inventory_order)._M_elems[0x1e] = '\x17';
  (this->_inventory_order)._M_elems[0x1f] = '\x1f';
  (this->_inventory_order)._M_elems[0] = '#';
  (this->_inventory_order)._M_elems[1] = '$';
  (this->_inventory_order)._M_elems[2] = '\0';
  (this->_inventory_order)._M_elems[3] = '-';
  (this->_inventory_order)._M_elems[4] = '\x14';
  (this->_inventory_order)._M_elems[5] = '\x13';
  (this->_inventory_order)._M_elems[6] = '.';
  (this->_inventory_order)._M_elems[7] = '\x12';
  (this->_inventory_order)._M_elems[8] = '\x15';
  (this->_inventory_order)._M_elems[9] = '\x1c';
  (this->_inventory_order)._M_elems[10] = '2';
  (this->_inventory_order)._M_elems[0xb] = '1';
  (this->_inventory_order)._M_elems[0xc] = '\x1b';
  (this->_inventory_order)._M_elems[0xd] = '/';
  (this->_inventory_order)._M_elems[0xe] = '+';
  (this->_inventory_order)._M_elems[0xf] = '7';
  (this->_inventory_order)._M_elems[0x20] = '\x1e';
  (this->_inventory_order)._M_elems[0x21] = '\x19';
  (this->_inventory_order)._M_elems[0x22] = '\x1a';
  (this->_inventory_order)._M_elems[0x23] = ' ';
  (this->_inventory_order)._M_elems[0x24] = '\x1d';
  (this->_inventory_order)._M_elems[0x25] = '5';
  (this->_inventory_order)._M_elems[0x26] = '\x18';
  (this->_inventory_order)._M_elems[0x27] = 0xff;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&personal_settings_file,"personalsettings",(allocator<char> *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&settings_json,"",(allocator<char> *)&local_250);
  ArgumentDictionary::get_string
            (&settings_path,args,(string *)&personal_settings_file,(string *)&settings_json);
  std::__cxx11::string::~string((string *)&settings_json);
  std::__cxx11::string::~string((string *)&personal_settings_file);
  if (settings_path._M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&settings_path,"./personal_settings.json");
  }
  std::ifstream::ifstream(&personal_settings_file,(string *)&settings_path,_S_in);
  if ((abStack_210[*(long *)(CONCAT44(uStack_22c,_personal_settings_file) + -0x18)] & 5) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Personal settings: \'");
    poVar4 = std::operator<<(poVar4,(string *)&settings_path);
    std::operator<<(poVar4,"\'\n");
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&settings_json,(nullptr_t)0x0);
    nlohmann::operator>>((istream *)&personal_settings_file,&settings_json);
    parse_json(this,&settings_json);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&settings_json);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Could not open \'");
    poVar4 = std::operator<<(poVar4,(string *)&settings_path);
    std::operator<<(poVar4,"\', will use default values.\n");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&settings_json,"ingametracker",(allocator<char> *)&local_290);
  bVar2 = ArgumentDictionary::contains(args,(string *)&settings_json);
  std::__cxx11::string::~string((string *)&settings_json);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&settings_json,"ingametracker",(allocator<char> *)&local_290);
    bVar2 = ArgumentDictionary::get_boolean(args,(string *)&settings_json,false);
    this->_add_ingame_item_tracker = bVar2;
    std::__cxx11::string::~string((string *)&settings_json);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&settings_json,"hudcolor",(allocator<char> *)&local_290);
  bVar2 = ArgumentDictionary::contains(args,(string *)&settings_json);
  std::__cxx11::string::~string((string *)&settings_json);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"hudcolor",&local_2b1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"",&local_2b2);
    ArgumentDictionary::get_string((string *)&settings_json,args,&local_290,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_290);
    CVar3 = parse_color_from_name_or_hex((string *)&settings_json);
    this->_hud_color = CVar3;
    std::__cxx11::string::~string((string *)&settings_json);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&settings_json,"nigelcolor",(allocator<char> *)&local_290);
  bVar2 = ArgumentDictionary::contains(args,(string *)&settings_json);
  std::__cxx11::string::~string((string *)&settings_json);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"nigelcolor",&local_2b1)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"",&local_2b2);
    ArgumentDictionary::get_string((string *)&settings_json,args,&local_290,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_290);
    CVar3 = parse_color_from_name_or_hex((string *)&settings_json);
    (this->_nigel_colors).first = CVar3;
    CVar3 = Color::subtract(&(this->_nigel_colors).first,'@');
    (this->_nigel_colors).second = CVar3;
    std::__cxx11::string::~string((string *)&settings_json);
  }
  std::ifstream::~ifstream(&personal_settings_file);
  std::__cxx11::string::~string((string *)&settings_path);
  return;
}

Assistant:

PersonalSettings::PersonalSettings(const ArgumentDictionary& args, const std::map<std::string, uint8_t>& item_names)
{
    _item_names = item_names;

    _inventory_order = {
            ITEM_RECORD_BOOK,   ITEM_SPELL_BOOK,
            ITEM_EKEEKE,        ITEM_DAHL,
            ITEM_GOLDEN_STATUE, ITEM_GAIA_STATUE,
            ITEM_RESTORATION,   ITEM_DETOX_GRASS,
            ITEM_MIND_REPAIR,   ITEM_ANTI_PARALYZE,
            ITEM_KEY,           ITEM_IDOL_STONE,
            ITEM_GARLIC,        ITEM_LOGS,
            ITEM_GOLA_EYE,      ITEM_GOLA_NAIL,
            ITEM_GOLA_HORN,     ITEM_GOLA_FANG,
            ITEM_DEATH_STATUE,  ITEM_CASINO_TICKET,
            ITEM_SHORT_CAKE,    ITEM_PAWN_TICKET,
            ITEM_ORACLE_STONE,  ITEM_LITHOGRAPH,
            ITEM_RED_JEWEL,     ITEM_PURPLE_JEWEL,
            ITEM_GREEN_JEWEL,   ITEM_BLUE_JEWEL,
            ITEM_YELLOW_JEWEL,  ITEM_SAFETY_PASS,
            ITEM_AXE_MAGIC,     ITEM_ARMLET,
            ITEM_SUN_STONE,     ITEM_BUYER_CARD,
            ITEM_LANTERN,       ITEM_EINSTEIN_WHISTLE,
            ITEM_STATUE_JYPTA,  ITEM_BELL,
            ITEM_BLUE_RIBBON,   0xFF
    };

    // Read settings from personal_settings.json file is it's present
    std::string settings_path = args.get_string("personalsettings");
    if(settings_path.empty())
        settings_path = "./personal_settings.json";

    std::ifstream personal_settings_file(settings_path);
    if(personal_settings_file)
    {
        std::cout << "Personal settings: '" << settings_path << "'\n";
        Json settings_json;
        personal_settings_file >> settings_json;
        this->parse_json(settings_json);
    }
    else
    {
        std::cout << "Could not open '"<< settings_path << "', will use default values.\n";
    }

    // Parse arguments from command line
    if(args.contains("ingametracker"))
        _add_ingame_item_tracker = args.get_boolean("ingametracker");

    if(args.contains("hudcolor"))
    {
        std::string hud_color_as_string = args.get_string("hudcolor");
        _hud_color = parse_color_from_name_or_hex(hud_color_as_string);
    }

    if(args.contains("nigelcolor"))
    {
        std::string nigel_color_as_string = args.get_string("nigelcolor");
        _nigel_colors.first = parse_color_from_name_or_hex(nigel_color_as_string);
        _nigel_colors.second = _nigel_colors.first.subtract(0x40);
    }
}